

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

int Fra_ClassesCountPairs(Fra_Cla_t *p)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  lVar3 = (long)p->vClasses->nSize;
  if (lVar3 < 1) {
    iVar2 = 0;
  }
  else {
    lVar4 = 0;
    iVar2 = 0;
    do {
      uVar5 = 0xffffffffffffffff;
      do {
        lVar1 = uVar5 * 8;
        uVar5 = uVar5 + 1;
      } while (*(long *)((long)p->vClasses->pArray[lVar4] + lVar1 + 8) != 0);
      if (uVar5 < 2) {
        __assert_fail("nNodes > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                      ,0xc4,"int Fra_ClassesCountPairs(Fra_Cla_t *)");
      }
      iVar2 = iVar2 + ((uint)(((int)uVar5 + -1) * (int)uVar5) >> 1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar3);
  }
  return iVar2;
}

Assistant:

int Fra_ClassesCountPairs( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass;
    int i, nNodes, nPairs = 0;
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        nNodes = Fra_ClassCount( pClass );
        assert( nNodes > 1 );
        nPairs += nNodes * (nNodes - 1) / 2;
    }
    return nPairs;
}